

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlText::Print(TiXmlText *this,FILE *cfile,int depth)

{
  int iVar1;
  TiXmlString buffer;
  
  if (cfile == (FILE *)0x0) {
    __assert_fail("cfile",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x471,"virtual void despot::util::tinyxml::TiXmlText::Print(FILE *, int) const");
  }
  if (this->cdata != true) {
    buffer.rep_ = (Rep *)TiXmlString::nullrep_;
    TiXmlBase::EncodeString(&(this->super_TiXmlNode).value,&buffer);
    fputs((buffer.rep_)->str,(FILE *)cfile);
    TiXmlString::quit(&buffer);
    return;
  }
  fputc(10,(FILE *)cfile);
  iVar1 = 0;
  if (0 < depth) {
    iVar1 = depth;
  }
  while (iVar1 != 0) {
    fwrite("    ",4,1,(FILE *)cfile);
    iVar1 = iVar1 + -1;
  }
  fprintf((FILE *)cfile,"<![CDATA[%s]]>\n",((this->super_TiXmlNode).value.rep_)->str);
  return;
}

Assistant:

void TiXmlText::Print(FILE* cfile, int depth) const {
	assert(cfile);
	if (cdata) {
		int i;
		fprintf(cfile, "\n");
		for (i = 0; i < depth; i++) {
			fprintf(cfile, "    ");
		}
		fprintf(cfile, "<![CDATA[%s]]>\n", value.c_str()); // unformatted output
	} else {
		TIXML_STRING buffer;
		EncodeString(value, &buffer);
		fprintf(cfile, "%s", buffer.c_str());
	}
}